

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fputs.c
# Opt level: O2

int fputs(char *__s,FILE *__stream)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  
  mtx_lock((mtx_t *)&__stream->_IO_save_base);
  iVar3 = _PDCLIB_prepwrite((_PDCLIB_file_t *)__stream);
  iVar4 = -1;
  if (iVar3 != -1) {
    for (; cVar1 = *__s, cVar1 != '\0'; __s = __s + 1) {
      pcVar2 = __stream->_IO_read_base;
      __stream->_IO_read_base = pcVar2 + 1;
      __stream->_IO_read_ptr[(long)pcVar2] = cVar1;
      if (((__stream->_IO_read_base == __stream->_IO_read_end) ||
          ((((ulong)__stream->_IO_buf_end & 0x200000000) != 0 && (*__s == '\n')))) &&
         (iVar3 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__stream), iVar3 == -1)) goto LAB_001056d4;
    }
    if ((((ulong)__stream->_IO_buf_end & 0x400000000) == 0) ||
       (iVar3 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__stream), iVar3 != -1)) {
      iVar4 = 0;
    }
  }
LAB_001056d4:
  mtx_unlock((mtx_t *)&__stream->_IO_save_base);
  return iVar4;
}

Assistant:

int fputs( const char * _PDCLIB_restrict s, struct _PDCLIB_file_t * _PDCLIB_restrict stream )
{
    _PDCLIB_LOCK( stream->mtx );

    if ( _PDCLIB_prepwrite( stream ) == EOF )
    {
        _PDCLIB_UNLOCK( stream->mtx );
        return EOF;
    }

    while ( *s != '\0' )
    {
        /* Unbuffered and line buffered streams get flushed when fputs() does
           write the terminating end-of-line. All streams get flushed if the
           buffer runs full.
        */
        stream->buffer[ stream->bufidx++ ] = *s;

        if ( ( stream->bufidx == stream->bufsize ) ||
             ( ( stream->status & _IOLBF ) && *s == '\n' )
           )
        {
            if ( _PDCLIB_flushbuffer( stream ) == EOF )
            {
                _PDCLIB_UNLOCK( stream->mtx );
                return EOF;
            }
        }

        ++s;
    }

    if ( stream->status & _IONBF )
    {
        if ( _PDCLIB_flushbuffer( stream ) == EOF )
        {
            _PDCLIB_UNLOCK( stream->mtx );
            return EOF;
        }
    }

    _PDCLIB_UNLOCK( stream->mtx );

    return 0;
}